

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v3_utl.cc
# Opt level: O0

char * strip_spaces(char *name)

{
  byte *pbVar1;
  int iVar2;
  size_t sVar3;
  bool bVar4;
  byte *local_28;
  char *q;
  char *p;
  char *name_local;
  
  q = name;
  while( true ) {
    bVar4 = false;
    if (*q != '\0') {
      iVar2 = OPENSSL_isspace((uint)(byte)*q);
      bVar4 = iVar2 != 0;
    }
    if (!bVar4) break;
    q = q + 1;
  }
  if (*q == '\0') {
    name_local = (char *)0x0;
  }
  else {
    sVar3 = strlen(q);
    local_28 = (byte *)(q + sVar3);
    do {
      pbVar1 = local_28;
      local_28 = pbVar1 + -1;
      bVar4 = false;
      if (local_28 != (byte *)q) {
        iVar2 = OPENSSL_isspace((uint)*local_28);
        bVar4 = iVar2 != 0;
      }
    } while (bVar4);
    if ((byte *)q != local_28) {
      *pbVar1 = 0;
    }
    if (*q == '\0') {
      name_local = (char *)0x0;
    }
    else {
      name_local = q;
    }
  }
  return name_local;
}

Assistant:

static char *strip_spaces(char *name) {
  char *p, *q;
  // Skip over leading spaces
  p = name;
  while (*p && OPENSSL_isspace((unsigned char)*p)) {
    p++;
  }
  if (!*p) {
    return NULL;
  }
  q = p + strlen(p) - 1;
  while ((q != p) && OPENSSL_isspace((unsigned char)*q)) {
    q--;
  }
  if (p != q) {
    q[1] = 0;
  }
  if (!*p) {
    return NULL;
  }
  return p;
}